

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

wins * create_wins_array(int argc,char **argv,int *ar_len)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  wins *pwVar3;
  Am_Drawonable *pAVar4;
  int local_2c;
  wins *wins_array;
  int *ar_len_local;
  char **argv_local;
  int argc_local;
  
  local_2c = argc;
  if (argc == 0) {
    local_2c = 1;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_2c;
  uVar2 = SUB168(auVar1 * ZEXT816(0x40),0);
  if (SUB168(auVar1 * ZEXT816(0x40),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pwVar3 = (wins *)operator_new__(uVar2);
  if (argc < 2) {
    pAVar4 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable((char *)0x0);
    pwVar3->root = pAVar4;
    *ar_len = 1;
  }
  else if (argc == 2) {
    pAVar4 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable(argv[1]);
    pwVar3->root = pAVar4;
    *ar_len = 1;
  }
  else if (argc == 3) {
    pAVar4 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable(argv[1]);
    pwVar3->root = pAVar4;
    pAVar4 = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable(argv[2]);
    pwVar3[1].root = pAVar4;
    *ar_len = 2;
  }
  return pwVar3;
}

Assistant:

wins *
create_wins_array(int argc, char **argv, int &ar_len)
{
  wins *wins_array = new wins[argc ? argc : 1];
  // On the Mac, argc is 0.  On Unix and PC, it is at least 1.
  if (argc <= 1) {
    wins_array[0].root = Am_Drawonable::Get_Root_Drawonable();
    ar_len = 1;
  } else if (argc == 2) {
    wins_array[0].root = Am_Drawonable::Get_Root_Drawonable(argv[1]);
    ar_len = 1;
  } else if (argc == 3) {
    wins_array[0].root = Am_Drawonable::Get_Root_Drawonable(argv[1]);
    wins_array[1].root = Am_Drawonable::Get_Root_Drawonable(argv[2]);
    ar_len = 2;
  }
  return wins_array;
}